

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O2

bool __thiscall Imf_3_2::Image::levelNumberIsValid(Image *this,int lx,int ly)

{
  long lVar1;
  
  if (-1 < lx) {
    lVar1 = (this->_levels)._sizeY;
    if ((-1 < ly && (long)(ulong)(uint)lx < lVar1) &&
       ((long)(ulong)(uint)ly < (this->_levels)._sizeX)) {
      return (this->_levels)._data[lVar1 * (ulong)(uint)ly + (ulong)(uint)lx] != (ImageLevel *)0x0;
    }
  }
  return false;
}

Assistant:

bool
Image::levelNumberIsValid (int lx, int ly) const
{
    return lx >= 0 && lx < _levels.width () && ly >= 0 &&
           ly < _levels.height () && _levels[ly][lx] != 0;
}